

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O1

void icu_63::UnifiedCache::getByLocale<icu_63::SharedDateFormatSymbols>
               (Locale *loc,SharedDateFormatSymbols **ptr,UErrorCode *status)

{
  UnifiedCache *this;
  LocaleCacheKey<icu_63::SharedDateFormatSymbols> local_118;
  
  this = getInstance(status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    LocaleCacheKey<icu_63::SharedDateFormatSymbols>::LocaleCacheKey(&local_118,loc);
    get<icu_63::SharedDateFormatSymbols>
              (this,&local_118.super_CacheKey<icu_63::SharedDateFormatSymbols>,(void *)0x0,ptr,
               status);
    local_118.super_CacheKey<icu_63::SharedDateFormatSymbols>.super_CacheKeyBase.super_UObject.
    _vptr_UObject = (_func_int **)&PTR__LocaleCacheKey_0047d678;
    Locale::~Locale(&local_118.fLoc);
    CacheKeyBase::~CacheKeyBase((CacheKeyBase *)&local_118);
  }
  return;
}

Assistant:

static void getByLocale(
           const Locale &loc, const T *&ptr, UErrorCode &status) {
       const UnifiedCache *cache = getInstance(status);
       if (U_FAILURE(status)) {
           return;
       }
       cache->get(LocaleCacheKey<T>(loc), ptr, status);
   }